

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int unicode_get_cc(uint32_t c)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint in_EDI;
  uint8_t *p;
  int pos;
  uint32_t b;
  uint32_t c1;
  uint32_t cc;
  uint32_t type;
  uint32_t n;
  uint32_t code;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint32_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  uint local_10;
  uint local_c;
  uint local_4;
  
  iVar2 = get_index_pos((uint32_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        in_stack_ffffffffffffffe4,
                        (uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (iVar2 < 0) {
    local_4 = 0;
  }
  else {
    pbVar4 = unicode_cc_table + iVar2;
    uVar3 = local_c;
    do {
      local_c = uVar3;
      pbVar5 = pbVar4 + 1;
      bVar1 = *pbVar4 >> 6;
      local_10 = *pbVar4 & 0x3f;
      if (0x2f < local_10) {
        if (local_10 < 0x38) {
          local_10 = ((uint)*pbVar5 | (local_10 - 0x30) * 0x100) + 0x30;
          pbVar5 = pbVar4 + 2;
        }
        else {
          local_10 = ((uint)pbVar4[2] | (uint)*pbVar5 << 8 | (local_10 - 0x38) * 0x100) + 0x830;
          pbVar5 = pbVar4 + 3;
        }
      }
      pbVar4 = pbVar5;
      if (bVar1 < 2) {
        pbVar4 = pbVar4 + 1;
      }
      uVar3 = local_c + local_10 + 1;
    } while (uVar3 <= in_EDI);
    switch(bVar1) {
    case 0:
      local_4 = (uint)pbVar4[-1];
      break;
    case 1:
      local_4 = (pbVar4[-1] + in_EDI) - local_c;
      break;
    case 2:
      local_4 = 0;
      break;
    default:
      local_4 = 0xe6;
    }
  }
  return local_4;
}

Assistant:

static int unicode_get_cc(uint32_t c)
{
    uint32_t code, n, type, cc, c1, b;
    int pos;
    const uint8_t *p;
    
    pos = get_index_pos(&code, c,
                        unicode_cc_index, sizeof(unicode_cc_index) / 3);
    if (pos < 0)
        return 0;
    p = unicode_cc_table + pos;
    for(;;) {
        b = *p++;
        type = b >> 6;
        n = b & 0x3f;
        if (n < 48) {
        } else if (n < 56) {
            n = (n - 48) << 8;
            n |= *p++;
            n += 48;
        } else {
            n = (n - 56) << 8;
            n |= *p++ << 8;
            n |= *p++;
            n += 48 + (1 << 11);
        }
        if (type <= 1)
            p++;
        c1 = code + n + 1;
        if (c < c1) {
            switch(type) {
            case 0:
                cc = p[-1];
                break;
            case 1:
                cc = p[-1] + c - code;
                break;
            case 2:
                cc = 0;
                break;
            default:
            case 3:
                cc = 230;
                break;
            }
            return cc;
        }
        code = c1;
    }
}